

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O1

int cmListFileLexer_yylex_init(yyscan_t *ptr_yy_globals)

{
  void *__s;
  int *piVar1;
  
  if (ptr_yy_globals == (yyscan_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  else {
    __s = malloc(0x90);
    *ptr_yy_globals = __s;
    if (__s != (void *)0x0) {
      memset(__s,0,0x90);
      return 0;
    }
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return 1;
}

Assistant:

int yylex_init(yyscan_t* ptr_yy_globals)
{
    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), NULL );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    return yy_init_globals ( *ptr_yy_globals );
}